

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O0

int luaV_lessthan(lua_State *L,TValue *l,TValue *r)

{
  int iVar1;
  int res;
  TValue *r_local;
  TValue *l_local;
  lua_State *L_local;
  
  if ((l->tt_ == 3) && (r->tt_ == 3)) {
    L_local._4_4_ = (uint)((l->value_).n < (r->value_).n);
  }
  else if (((l->tt_ & 0xfU) == 4) && ((r->tt_ & 0xfU) == 4)) {
    iVar1 = l_strcmp(&((l->value_).gc)->ts,&((r->value_).gc)->ts);
    L_local._4_4_ = (uint)(iVar1 < 0);
  }
  else {
    L_local._4_4_ = call_orderTM(L,l,r,TM_LT);
    if ((int)L_local._4_4_ < 0) {
      luaG_ordererror(L,l,r);
    }
  }
  return L_local._4_4_;
}

Assistant:

int luaV_lessthan (lua_State *L, const TValue *l, const TValue *r) {
  int res;
  if (ttisnumber(l) && ttisnumber(r))
    return luai_numlt(L, nvalue(l), nvalue(r));
  else if (ttisstring(l) && ttisstring(r))
    return l_strcmp(rawtsvalue(l), rawtsvalue(r)) < 0;
  else if ((res = call_orderTM(L, l, r, TM_LT)) < 0)
    luaG_ordererror(L, l, r);
  return res;
}